

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailureNaNTest.cpp
# Opt level: O1

void __thiscall
TEST_TestFailureNanAndInf_DoublesEqualExpectedIsNaN_Test::testBody
          (TEST_TestFailureNanAndInf_DoublesEqualExpectedIsNaN_Test *this)

{
  UtestShell *pUVar1;
  char *pcVar2;
  TestTerminator *pTVar3;
  DoublesEqualFailure f;
  undefined1 local_88 [120];
  
  pUVar1 = (this->super_TEST_GROUP_CppUTestGroupTestFailureNanAndInf).test;
  SimpleString::SimpleString((SimpleString *)local_88,"");
  DoublesEqualFailure::DoublesEqualFailure
            ((DoublesEqualFailure *)(local_88 + 0x10),pUVar1,"fail.cpp",2,NAN,2.0,3.0,
             (SimpleString *)local_88);
  SimpleString::~SimpleString((SimpleString *)local_88);
  pUVar1 = UtestShell::getCurrent();
  TestFailure::getMessage((TestFailure *)local_88);
  pcVar2 = SimpleString::asCharString((SimpleString *)local_88);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[9])
            (pUVar1,
             "expected <Nan - Not a number>\n\tbut was  <2> threshold used was <3>\n\tCannot make comparisons with Nan"
             ,pcVar2,"",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestFailureNaNTest.cpp"
             ,0x40,pTVar3);
  SimpleString::~SimpleString((SimpleString *)local_88);
  TestFailure::~TestFailure((TestFailure *)(local_88 + 0x10));
  return;
}

Assistant:

TEST(TestFailureNanAndInf, DoublesEqualExpectedIsNaN)
{
    DoublesEqualFailure f(test, failFileName, failLineNumber, (double)NAN, 2.0, 3.0, "");
    FAILURE_EQUAL("expected <Nan - Not a number>\n"
                "\tbut was  <2> threshold used was <3>\n"
                "\tCannot make comparisons with Nan", f);
}